

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_fldl_FT0_x86_64(CPUX86State *env,uint64_t val)

{
  floatx80 fVar1;
  undefined6 uStack_26;
  anon_union_8_2_947300a4 u;
  uint64_t val_local;
  CPUX86State *env_local;
  
  fVar1 = float64_to_floatx80_x86_64(val,&env->fp_status);
  (env->ft0).low = fVar1.low;
  *(ulong *)&(env->ft0).high = CONCAT62(uStack_26,fVar1.high);
  return;
}

Assistant:

void helper_fldl_FT0(CPUX86State *env, uint64_t val)
{
    union {
        float64 f;
        uint64_t i;
    } u;

    u.i = val;
    FT0 = float64_to_floatx80(u.f, &env->fp_status);
}